

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

int gej_xyz_equals_gej(secp256k1_gej *a,secp256k1_gej *b)

{
  undefined1 *puVar1;
  int *piVar2;
  secp256k1_fe *r;
  byte bVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_EAX;
  uint32_t uVar6;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  secp256k1_scratch_space *scratch;
  code *pcVar7;
  byte bVar8;
  long lVar9;
  uint extraout_EDX;
  uint count;
  ulong uVar10;
  long extraout_RDX;
  secp256k1_ge *scratch_00;
  size_t sVar11;
  secp256k1_gej *r_00;
  secp256k1_ge *r_01;
  uint uVar12;
  secp256k1_ge *psVar13;
  secp256k1_strauss_point_state *psVar14;
  uchar *out32;
  secp256k1_sha256 *psVar15;
  secp256k1_ge *psVar16;
  ulong uVar17;
  secp256k1_ge *psVar18;
  secp256k1_gej *psVar19;
  ulong uVar20;
  ulong uVar21;
  secp256k1_ge *a_00;
  secp256k1_gej *psVar22;
  secp256k1_gej *psVar23;
  ulong uVar24;
  code *cb;
  secp256k1_ge *psVar25;
  secp256k1_callback *error_callback;
  secp256k1_sha256 *hash;
  uint uVar26;
  secp256k1_ge *r_02;
  secp256k1_ge *r_03;
  secp256k1_scalar *psVar27;
  secp256k1_ge *r_04;
  secp256k1_ge *a_01;
  secp256k1_sha256 *psVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  secp256k1_gej b2;
  secp256k1_gej a2;
  ulong uStack_28a0;
  secp256k1_strauss_state sStack_2898;
  secp256k1_strauss_point_state sStack_2880;
  secp256k1_fe asStack_2470 [8];
  secp256k1_ge asStack_22f0 [8];
  secp256k1_gej *psStack_1fa8;
  secp256k1_callback *psStack_1fa0;
  secp256k1_ge *psStack_1f90;
  secp256k1_strauss_point_state *psStack_1f88;
  secp256k1_scalar *psStack_1f80;
  undefined1 auStack_1f68 [8];
  undefined1 auStack_1f60 [176];
  secp256k1_gej sStack_1eb0;
  secp256k1_gej sStack_1e18;
  secp256k1_gej sStack_1d80;
  secp256k1_gej sStack_1ce8;
  secp256k1_gej sStack_1c50;
  secp256k1_gej asStack_1bb8 [2];
  secp256k1_gej asStack_1a38 [5];
  secp256k1_strauss_point_state sStack_16f8;
  secp256k1_scratch_space *psStack_12e0;
  secp256k1_sha256 *psStack_12d8;
  undefined1 *puStack_12d0;
  secp256k1_gej *psStack_12c8;
  secp256k1_gej *psStack_12c0;
  code *pcStack_12b8;
  undefined4 uStack_12a6;
  undefined2 uStack_12a2;
  secp256k1_gej *psStack_12a0;
  long lStack_1298;
  undefined1 auStack_1290 [40];
  undefined8 uStack_1268;
  uint64_t uStack_1260;
  uint64_t uStack_1258;
  secp256k1_sha256 sStack_1250;
  secp256k1_sha256 sStack_11e0;
  secp256k1_gej *psStack_1178;
  secp256k1_ge *psStack_1170;
  secp256k1_ge *psStack_1168;
  secp256k1_ge *psStack_1160;
  secp256k1_gej *psStack_1158;
  secp256k1_strauss_point_state *psStack_1150;
  undefined1 auStack_1148 [32];
  undefined1 auStack_1128 [40];
  secp256k1_ge *psStack_1100;
  secp256k1_strauss_point_state *psStack_10f8;
  secp256k1_gej sStack_10f0;
  secp256k1_gej sStack_1058;
  secp256k1_gej sStack_fc0;
  secp256k1_ge sStack_f28;
  secp256k1_gej sStack_ec0;
  secp256k1_ge asStack_e28 [3];
  secp256k1_ge asStack_ca8 [8];
  secp256k1_strauss_point_state sStack_968;
  secp256k1_ge *psStack_550;
  secp256k1_ge *psStack_548;
  secp256k1_ge *psStack_540;
  ulong uStack_538;
  secp256k1_ge *psStack_530;
  code *pcStack_528;
  code *pcStack_520;
  uint uStack_50c;
  int iStack_508;
  int iStack_504;
  secp256k1_ge *psStack_500;
  ulong uStack_4f8;
  secp256k1_ge *psStack_4f0;
  secp256k1_ge *psStack_4e8;
  secp256k1_ge *psStack_4e0;
  secp256k1_ge *psStack_4d8;
  secp256k1_ge *psStack_4d0;
  secp256k1_ge *psStack_4c8;
  uint uStack_4b4;
  undefined1 auStack_4b0 [56];
  ulong uStack_478;
  ulong uStack_470;
  ulong uStack_468;
  ulong uStack_460;
  ulong uStack_458;
  undefined1 auStack_450 [72];
  uint64_t uStack_408;
  uint64_t uStack_400;
  uint64_t uStack_3f8;
  ulong uStack_3f0;
  ulong uStack_3e8;
  secp256k1_ge *psStack_3d8;
  secp256k1_ge *psStack_3d0;
  uint64_t uStack_3c8;
  uint64_t uStack_3c0;
  uint64_t uStack_3b8;
  uint64_t uStack_3b0;
  uint64_t uStack_3a8;
  uint64_t uStack_3a0;
  uint64_t uStack_398;
  uint64_t uStack_390;
  uint64_t uStack_388;
  undefined1 auStack_380 [56];
  uint64_t uStack_348;
  uint64_t uStack_340;
  uint64_t uStack_338;
  secp256k1_ge *psStack_330;
  uint uStack_328;
  secp256k1_ge sStack_310;
  secp256k1_ge sStack_2a0;
  secp256k1_gej sStack_230;
  secp256k1_fe *psStack_198;
  secp256k1_ge *psStack_190;
  secp256k1_ge *psStack_188;
  secp256k1_ge *psStack_180;
  secp256k1_ge *psStack_178;
  secp256k1_ge *psStack_170;
  undefined1 local_160 [92];
  int local_104;
  undefined1 local_100 [100];
  int local_9c;
  secp256k1_ge local_98;
  
  bVar3 = 0;
  uVar4 = 0;
  if ((a->infinity != b->infinity) || (uVar4 = 1, a->infinity != 0)) {
    return uVar4;
  }
  r_02 = (secp256k1_ge *)(local_100 + 0x38);
  psStack_170 = (secp256k1_ge *)0x14c959;
  memcpy(r_02,a,0x98);
  psVar13 = (secp256k1_ge *)local_160;
  psStack_170 = (secp256k1_ge *)0x14c96e;
  memcpy(psVar13,b,0x98);
  psStack_170 = (secp256k1_ge *)0x14c976;
  secp256k1_fe_normalize((secp256k1_fe *)r_02);
  r_04 = &local_98;
  psStack_170 = (secp256k1_ge *)0x14c986;
  secp256k1_fe_normalize(&r_04->x);
  r = &local_98.y;
  psStack_170 = (secp256k1_ge *)0x14c996;
  secp256k1_fe_normalize(r);
  psStack_170 = (secp256k1_ge *)0x14c99e;
  secp256k1_fe_normalize((secp256k1_fe *)psVar13);
  psVar25 = (secp256k1_ge *)(local_160 + 0x30);
  psStack_170 = (secp256k1_ge *)0x14c9ab;
  secp256k1_fe_normalize((secp256k1_fe *)psVar25);
  r_03 = (secp256k1_ge *)local_100;
  psStack_170 = (secp256k1_ge *)0x14c9b8;
  secp256k1_fe_normalize((secp256k1_fe *)r_03);
  psStack_170 = (secp256k1_ge *)0x14c9c0;
  secp256k1_fe_verify((secp256k1_fe *)r_02);
  psStack_170 = (secp256k1_ge *)0x14c9c8;
  psVar16 = psVar13;
  secp256k1_fe_verify((secp256k1_fe *)psVar13);
  if (local_9c == 0) {
    psStack_170 = (secp256k1_ge *)0x14cacd;
    gej_xyz_equals_gej_cold_6();
LAB_0014cacd:
    psStack_170 = (secp256k1_ge *)0x14cad2;
    gej_xyz_equals_gej_cold_5();
LAB_0014cad2:
    psStack_170 = (secp256k1_ge *)0x14cad7;
    gej_xyz_equals_gej_cold_4();
LAB_0014cad7:
    psStack_170 = (secp256k1_ge *)0x14cadc;
    gej_xyz_equals_gej_cold_3();
LAB_0014cadc:
    psStack_170 = (secp256k1_ge *)0x14cae1;
    gej_xyz_equals_gej_cold_2();
  }
  else {
    if (local_160._44_4_ == 0) goto LAB_0014cacd;
    uVar4 = 4;
    do {
      uVar20 = *(ulong *)(local_160 + (ulong)uVar4 * 8);
      uVar10 = *(ulong *)(local_100 + (ulong)uVar4 * 8 + 0x38);
      if (uVar10 >= uVar20 && uVar10 != uVar20) {
        psVar13 = (secp256k1_ge *)0x1;
        goto LAB_0014ca0a;
      }
      if (uVar10 < uVar20) {
        psVar13 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014ca0a;
      }
      bVar29 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar29);
    psVar13 = (secp256k1_ge *)0x0;
LAB_0014ca0a:
    psStack_170 = (secp256k1_ge *)0x14ca12;
    secp256k1_fe_verify(&r_04->x);
    psStack_170 = (secp256k1_ge *)0x14ca1a;
    psVar16 = psVar25;
    secp256k1_fe_verify((secp256k1_fe *)psVar25);
    if (local_98.x.normalized == 0) goto LAB_0014cad2;
    if (local_104 == 0) goto LAB_0014cad7;
    uVar4 = 4;
    do {
      uVar20 = *(ulong *)(local_160 + (ulong)uVar4 * 8 + 0x30);
      uVar10 = local_98.x.n[uVar4];
      if (uVar10 >= uVar20 && uVar10 != uVar20) {
        r_04 = (secp256k1_ge *)0x1;
        goto LAB_0014ca63;
      }
      if (uVar10 < uVar20) {
        r_04 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014ca63;
      }
      bVar29 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar29);
    r_04 = (secp256k1_ge *)0x0;
LAB_0014ca63:
    psStack_170 = (secp256k1_ge *)0x14ca6b;
    secp256k1_fe_verify(r);
    psStack_170 = (secp256k1_ge *)0x14ca73;
    psVar16 = r_03;
    secp256k1_fe_verify((secp256k1_fe *)r_03);
    if (local_98.y.normalized == 0) goto LAB_0014cadc;
    if (local_100._44_4_ != 0) {
      uVar4 = 4;
      do {
        if (local_98.y.n[uVar4] != *(uint64_t *)(local_100 + (ulong)uVar4 * 8)) {
          bVar29 = true;
          goto LAB_0014caae;
        }
        bVar29 = uVar4 != 0;
        uVar4 = uVar4 - 1;
      } while (bVar29);
      bVar29 = false;
LAB_0014caae:
      return (uint)(((int)r_04 == 0 && (int)psVar13 == 0) && !bVar29);
    }
  }
  psStack_170 = (secp256k1_ge *)test_pre_g_table;
  gej_xyz_equals_gej_cold_1();
  r_01 = &sStack_310;
  psStack_4c8 = (secp256k1_ge *)0x14cb12;
  psStack_3d8 = psVar16;
  psStack_198 = r;
  psStack_190 = psVar25;
  psStack_188 = r_02;
  psStack_180 = r_03;
  psStack_178 = r_04;
  psStack_170 = psVar13;
  secp256k1_ge_from_storage(r_01,(secp256k1_ge_storage *)psVar16);
  psStack_4c8 = (secp256k1_ge *)0x14cb1a;
  a_00 = r_01;
  iVar5 = secp256k1_ge_is_valid_var(r_01);
  if (iVar5 != 0) {
    psStack_4c8 = (secp256k1_ge *)0x14cb51;
    secp256k1_gej_set_ge(&sStack_230,&sStack_310);
    psStack_4c8 = (secp256k1_ge *)0x14cb5e;
    secp256k1_gej_double_var(&sStack_230,&sStack_230,(secp256k1_fe *)0x0);
    psStack_4c8 = (secp256k1_ge *)0x14cb6e;
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStack_380,&sStack_230);
    r_01 = (secp256k1_ge *)0x40;
    uStack_4b4 = auStack_380._40_4_;
    while( true ) {
      uVar4 = uStack_4b4;
      psVar18 = (secp256k1_ge *)(ulong)uStack_4b4;
      a_01 = (secp256k1_ge *)0x3fffffffffffc;
      psVar13 = (secp256k1_ge *)0xffffffffffff;
      psStack_4c8 = (secp256k1_ge *)0x14cb8c;
      secp256k1_fe_verify(&sStack_310.x);
      psVar16 = (secp256k1_ge *)0x1;
      psStack_4c8 = (secp256k1_ge *)0x14cb99;
      secp256k1_fe_verify_magnitude(&sStack_310.x,1);
      auStack_4b0._48_8_ = 0x3ffffbfffff0bc - sStack_310.x.n[0];
      uStack_478 = 0x3ffffffffffffc - sStack_310.x.n[1];
      uStack_470 = 0x3ffffffffffffc - sStack_310.x.n[2];
      uStack_468 = 0x3ffffffffffffc - sStack_310.x.n[3];
      uStack_460 = 0x3fffffffffffc - sStack_310.x.n[4];
      uStack_458._0_4_ = 2;
      uStack_458._4_4_ = 0;
      r_02 = (secp256k1_ge *)(auStack_4b0 + 0x30);
      psStack_4c8 = (secp256k1_ge *)0x14cbed;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      psStack_4c8 = (secp256k1_ge *)0x14cbf5;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      a_00 = (secp256k1_ge *)auStack_380;
      psStack_4c8 = (secp256k1_ge *)0x14cc02;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      if (0x20 < (int)((int)uStack_458 + uVar4)) break;
      uStack_3a0 = auStack_380._0_8_;
      uStack_398 = auStack_380._8_8_;
      auStack_4b0._48_8_ = auStack_4b0._48_8_ + auStack_380._0_8_;
      uStack_478 = uStack_478 + auStack_380._8_8_;
      uStack_390 = auStack_380._16_8_;
      uStack_388 = auStack_380._24_8_;
      uStack_470 = uStack_470 + auStack_380._16_8_;
      uStack_468 = uStack_468 + auStack_380._24_8_;
      uStack_3c8 = auStack_380._32_8_;
      uStack_460 = uStack_460 + auStack_380._32_8_;
      uStack_458 = (ulong)((int)uStack_458 + uVar4);
      psStack_4c8 = (secp256k1_ge *)0x14cc87;
      auStack_450._56_8_ = r_01;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      psStack_4c8 = (secp256k1_ge *)0x14cc8f;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      auStack_4b0._48_8_ = (uStack_460 >> 0x30) * 0x1000003d1 + auStack_4b0._48_8_;
      uStack_478 = ((ulong)auStack_4b0._48_8_ >> 0x34) + uStack_478;
      uStack_470 = (uStack_478 >> 0x34) + uStack_470;
      uVar20 = (uStack_470 >> 0x34) + uStack_468;
      psVar25 = (secp256k1_ge *)0xfffffffffffff;
      uStack_468 = uVar20 & 0xfffffffffffff;
      uStack_460 = (uVar20 >> 0x34) + (uStack_460 & 0xffffffffffff);
      uStack_470 = uStack_470 & 0xfffffffffffff;
      uStack_478 = uStack_478 & 0xfffffffffffff;
      auStack_4b0._48_8_ = auStack_4b0._48_8_ & 0xfffffffffffff;
      uStack_458 = CONCAT44(uStack_458._4_4_,1);
      psStack_4c8 = (secp256k1_ge *)0x14cd1e;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      psStack_4c8 = (secp256k1_ge *)0x14cd2e;
      secp256k1_fe_verify(&sStack_310.y);
      psVar16 = (secp256k1_ge *)0x1;
      psStack_4c8 = (secp256k1_ge *)0x14cd3b;
      secp256k1_fe_verify_magnitude(&sStack_310.y,1);
      auStack_4b0._0_8_ = 0x3ffffbfffff0bc - sStack_310.y.n[0];
      auStack_4b0._8_8_ = 0x3ffffffffffffc - sStack_310.y.n[1];
      auStack_4b0._16_8_ = 0x3ffffffffffffc - sStack_310.y.n[2];
      auStack_4b0._24_8_ = 0x3ffffffffffffc - sStack_310.y.n[3];
      auStack_4b0._32_8_ = 0x3fffffffffffc - sStack_310.y.n[4];
      auStack_4b0._40_4_ = 2;
      auStack_4b0._44_4_ = 0;
      psVar18 = (secp256k1_ge *)auStack_4b0;
      psStack_4c8 = (secp256k1_ge *)0x14cd8f;
      secp256k1_fe_verify((secp256k1_fe *)psVar18);
      psStack_4c8 = (secp256k1_ge *)0x14cd97;
      secp256k1_fe_verify((secp256k1_fe *)psVar18);
      a_00 = (secp256k1_ge *)(auStack_380 + 0x30);
      psStack_4c8 = (secp256k1_ge *)0x14cda4;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      uVar4 = uStack_328;
      r_01 = (secp256k1_ge *)(ulong)uStack_328;
      if (0x20 < (int)(auStack_4b0._40_4_ + uStack_328)) goto LAB_0014d4a1;
      uStack_3c0 = auStack_380._48_8_;
      uStack_3b8 = uStack_348;
      auStack_4b0._0_8_ = auStack_4b0._0_8_ + auStack_380._48_8_;
      auStack_4b0._8_8_ = auStack_4b0._8_8_ + uStack_348;
      uStack_3b0 = uStack_340;
      uStack_3a8 = uStack_338;
      auStack_4b0._16_8_ = auStack_4b0._16_8_ + uStack_340;
      auStack_4b0._24_8_ = auStack_4b0._24_8_ + uStack_338;
      psStack_3d0 = psStack_330;
      auStack_4b0._32_8_ = (long)(psStack_330->x).n + auStack_4b0._32_8_;
      auStack_4b0._44_4_ = 0;
      auStack_4b0._40_4_ = auStack_4b0._40_4_ + uStack_328;
      psStack_4c8 = (secp256k1_ge *)0x14ce27;
      secp256k1_fe_verify((secp256k1_fe *)psVar18);
      psStack_4c8 = (secp256k1_ge *)0x14ce2f;
      secp256k1_fe_verify((secp256k1_fe *)psVar18);
      a_01 = (secp256k1_ge *)0x1000003d1;
      auStack_4b0._0_8_ = ((ulong)auStack_4b0._32_8_ >> 0x30) * 0x1000003d1 + auStack_4b0._0_8_;
      auStack_4b0._8_8_ = ((ulong)auStack_4b0._0_8_ >> 0x34) + auStack_4b0._8_8_;
      auStack_4b0._16_8_ = ((ulong)auStack_4b0._8_8_ >> 0x34) + auStack_4b0._16_8_;
      uVar20 = ((ulong)auStack_4b0._16_8_ >> 0x34) + auStack_4b0._24_8_;
      auStack_4b0._24_8_ = uVar20 & 0xfffffffffffff;
      auStack_4b0._32_8_ = (uVar20 >> 0x34) + (auStack_4b0._32_8_ & 0xffffffffffff);
      auStack_4b0._16_8_ = auStack_4b0._16_8_ & 0xfffffffffffff;
      auStack_4b0._8_8_ = auStack_4b0._8_8_ & 0xfffffffffffff;
      auStack_4b0._0_8_ = auStack_4b0._0_8_ & 0xfffffffffffff;
      auStack_4b0._40_4_ = 1;
      psStack_4c8 = (secp256k1_ge *)0x14ceb4;
      secp256k1_fe_verify((secp256k1_fe *)psVar18);
      psStack_4c8 = (secp256k1_ge *)0x14cebc;
      secp256k1_fe_verify((secp256k1_fe *)r_02);
      uVar20 = (uStack_460 >> 0x30) * 0x1000003d1 + auStack_4b0._48_8_;
      r_02 = (secp256k1_ge *)0xffffefffffc2f;
      if (((uVar20 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar20 & 0xfffffffffffff) == 0)) {
        uVar10 = (uVar20 >> 0x34) + uStack_478;
        uVar17 = (uVar10 >> 0x34) + uStack_470;
        uVar21 = (uVar17 >> 0x34) + uStack_468;
        uVar24 = (uVar21 >> 0x34) + (uStack_460 & 0xffffffffffff);
        if ((((uVar10 | uVar20 | uVar17 | uVar21) & 0xfffffffffffff) != 0 || uVar24 != 0) &&
           ((uVar20 + 0x1000003d0 & uVar10 & uVar17 & uVar21 & (uVar24 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014d046;
        psStack_4c8 = (secp256k1_ge *)0x14cf84;
        secp256k1_fe_verify((secp256k1_fe *)auStack_4b0);
        uVar20 = ((ulong)auStack_4b0._32_8_ >> 0x30) * 0x1000003d1 + auStack_4b0._0_8_;
        if (((uVar20 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar20 & 0xfffffffffffff) != 0))
        goto LAB_0014d046;
        uVar10 = (uVar20 >> 0x34) + auStack_4b0._8_8_;
        psVar16 = (secp256k1_ge *)((uVar10 >> 0x34) + auStack_4b0._16_8_);
        a_00 = (secp256k1_ge *)(((ulong)psVar16 >> 0x34) + auStack_4b0._24_8_);
        uVar17 = ((ulong)a_00 >> 0x34) + (auStack_4b0._32_8_ & 0xffffffffffff);
        r_03 = psVar18;
        r_04 = a_01;
        if ((((uVar10 | uVar20 | (ulong)psVar16 | (ulong)a_00) & 0xfffffffffffff) != 0 ||
             uVar17 != 0) &&
           ((uVar20 + 0x1000003d0 & uVar10 & (ulong)psVar16 & (ulong)a_00 &
            (uVar17 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014d046;
        goto LAB_0014d4bf;
      }
LAB_0014d046:
      psVar16 = (secp256k1_ge *)
                ((long)(psStack_3d8->x).n + (long)((secp256k1_fe *)auStack_450._56_8_)->n);
      psVar25 = &sStack_2a0;
      psStack_4c8 = (secp256k1_ge *)0x14d06a;
      secp256k1_ge_from_storage(psVar25,(secp256k1_ge_storage *)psVar16);
      psStack_4c8 = (secp256k1_ge *)0x14d072;
      a_00 = psVar25;
      iVar5 = secp256k1_ge_is_valid_var(psVar25);
      if (iVar5 == 0) goto LAB_0014d4a6;
      psStack_4c8 = (secp256k1_ge *)0x14d082;
      secp256k1_fe_verify(&psVar25->x);
      psVar16 = (secp256k1_ge *)0x1;
      psStack_4c8 = (secp256k1_ge *)0x14d08f;
      secp256k1_fe_verify_magnitude(&psVar25->x,1);
      auStack_450._0_8_ = 0x3ffffbfffff0bc - sStack_2a0.x.n[0];
      auStack_450._8_8_ = 0x3ffffffffffffc - sStack_2a0.x.n[1];
      auStack_450._16_8_ = 0x3ffffffffffffc - sStack_2a0.x.n[2];
      auStack_450._24_8_ = 0x3ffffffffffffc - sStack_2a0.x.n[3];
      auStack_450._32_8_ = 0x3fffffffffffc - sStack_2a0.x.n[4];
      auStack_450._40_8_ = 2;
      psVar13 = (secp256k1_ge *)auStack_450;
      psStack_4c8 = (secp256k1_ge *)0x14d0f3;
      secp256k1_fe_verify((secp256k1_fe *)psVar13);
      psStack_4c8 = (secp256k1_ge *)0x14d0fb;
      secp256k1_fe_verify((secp256k1_fe *)psVar13);
      a_00 = (secp256k1_ge *)auStack_380;
      psStack_4c8 = (secp256k1_ge *)0x14d108;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      r_03 = psStack_3d0;
      if (0x20 < (int)(auStack_450._40_4_ + uStack_4b4)) goto LAB_0014d4ab;
      psVar25 = (secp256k1_ge *)0xffffefffffc2f;
      r_02 = (secp256k1_ge *)0x1000003d1;
      auStack_450._0_8_ = uStack_3a0 + auStack_450._0_8_;
      auStack_450._8_8_ = uStack_398 + auStack_450._8_8_;
      auStack_450._16_8_ = uStack_390 + auStack_450._16_8_;
      auStack_450._24_8_ = uStack_388 + auStack_450._24_8_;
      auStack_450._32_8_ = auStack_450._32_8_ + uStack_3c8;
      auStack_450._44_4_ = 0;
      auStack_450._40_4_ = auStack_450._40_4_ + uStack_4b4;
      psStack_4c8 = (secp256k1_ge *)0x14d186;
      secp256k1_fe_verify((secp256k1_fe *)psVar13);
      uStack_3f0 = sStack_2a0.y.n[4];
      uStack_3e8._0_4_ = sStack_2a0.y.magnitude;
      uStack_3e8._4_4_ = sStack_2a0.y.normalized;
      uStack_400 = sStack_2a0.y.n[2];
      uStack_3f8 = sStack_2a0.y.n[3];
      auStack_450._64_8_ = sStack_2a0.y.n[0];
      uStack_408 = sStack_2a0.y.n[1];
      r_04 = (secp256k1_ge *)(auStack_450 + 0x40);
      psStack_4c8 = (secp256k1_ge *)0x14d1c1;
      secp256k1_fe_verify((secp256k1_fe *)r_04);
      a_00 = (secp256k1_ge *)(auStack_380 + 0x30);
      psStack_4c8 = (secp256k1_ge *)0x14d1ce;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      uVar4 = uVar4 + (int)uStack_3e8;
      r_01 = (secp256k1_ge *)(ulong)uVar4;
      psVar18 = r_03;
      a_01 = r_04;
      if (0x20 < (int)uVar4) goto LAB_0014d4b0;
      auStack_450._64_8_ = uStack_3c0 + auStack_450._64_8_;
      uStack_408 = uStack_3b8 + uStack_408;
      uStack_400 = uStack_3b0 + uStack_400;
      uStack_3f8 = uStack_3a8 + uStack_3f8;
      uStack_3f0 = (long)(r_03->x).n + uStack_3f0;
      uStack_3e8 = (ulong)uVar4;
      psStack_4c8 = (secp256k1_ge *)0x14d236;
      secp256k1_fe_verify((secp256k1_fe *)r_04);
      psStack_4c8 = (secp256k1_ge *)0x14d23e;
      secp256k1_fe_verify((secp256k1_fe *)psVar13);
      uVar20 = ((ulong)auStack_450._32_8_ >> 0x30) * 0x1000003d1 + auStack_450._0_8_;
      if (((uVar20 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar20 & 0xfffffffffffff) == 0)) {
        uVar10 = (uVar20 >> 0x34) + auStack_450._8_8_;
        uVar17 = (uVar10 >> 0x34) + auStack_450._16_8_;
        uVar21 = (uVar17 >> 0x34) + auStack_450._24_8_;
        uVar24 = (uVar21 >> 0x34) + (auStack_450._32_8_ & 0xffffffffffff);
        if ((((uVar10 | uVar20 | uVar17 | uVar21) & 0xfffffffffffff) != 0 || uVar24 != 0) &&
           ((uVar20 + 0x1000003d0 & uVar10 & uVar17 & uVar21 & (uVar24 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014d3de;
        psStack_4c8 = (secp256k1_ge *)0x14d30d;
        secp256k1_fe_verify((secp256k1_fe *)r_04);
        uVar20 = (uStack_3f0 >> 0x30) * 0x1000003d1 + auStack_450._64_8_;
        if (((uVar20 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar20 & 0xfffffffffffff) != 0))
        goto LAB_0014d3de;
        uVar10 = (uVar20 >> 0x34) + uStack_408;
        psVar16 = (secp256k1_ge *)((uVar10 >> 0x34) + uStack_400);
        a_00 = (secp256k1_ge *)(((ulong)psVar16 >> 0x34) + uStack_3f8);
        uVar17 = ((ulong)a_00 >> 0x34) + (uStack_3f0 & 0xffffffffffff);
        if ((((uVar10 | uVar20 | (ulong)psVar16 | (ulong)a_00) & 0xfffffffffffff) != 0 ||
             uVar17 != 0) &&
           ((uVar20 + 0x1000003d0 & uVar10 & (ulong)psVar16 & (ulong)a_00 &
            (uVar17 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014d3de;
        goto LAB_0014d4c4;
      }
LAB_0014d3de:
      a_01 = (secp256k1_ge *)(auStack_4b0 + 0x30);
      psVar13 = (secp256k1_ge *)auStack_450;
      psStack_4c8 = (secp256k1_ge *)0x14d3f6;
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)a_01,(secp256k1_fe *)psVar13);
      r_02 = (secp256k1_ge *)auStack_4b0;
      if (iVar5 != 0) {
        psStack_4c8 = (secp256k1_ge *)0x14d40a;
        psVar16 = r_04;
        a_00 = r_02;
        iVar5 = secp256k1_fe_equal((secp256k1_fe *)r_02,(secp256k1_fe *)r_04);
        if (iVar5 == 0) goto LAB_0014d412;
        goto LAB_0014d4ba;
      }
LAB_0014d412:
      psStack_4c8 = (secp256k1_ge *)0x14d420;
      secp256k1_fe_mul((secp256k1_fe *)a_01,(secp256k1_fe *)a_01,(secp256k1_fe *)r_04);
      psStack_4c8 = (secp256k1_ge *)0x14d42e;
      secp256k1_fe_mul((secp256k1_fe *)r_02,(secp256k1_fe *)r_02,(secp256k1_fe *)psVar13);
      psStack_4c8 = (secp256k1_ge *)0x14d439;
      psVar16 = r_02;
      a_00 = a_01;
      iVar5 = secp256k1_fe_equal((secp256k1_fe *)a_01,(secp256k1_fe *)r_02);
      if (iVar5 == 0) goto LAB_0014d4b5;
      psVar16 = &sStack_2a0;
      psVar13 = &sStack_310;
      for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
        (psVar13->x).n[0] = (psVar16->x).n[0];
        psVar16 = (secp256k1_ge *)((long)psVar16 + ((ulong)bVar3 * -2 + 1) * 8);
        psVar13 = (secp256k1_ge *)((long)psVar13 + ((ulong)bVar3 * -2 + 1) * 8);
      }
      r_01 = (secp256k1_ge *)(((secp256k1_fe *)(auStack_450._56_8_ + 0x30))->n + 2);
      if (r_01 == (secp256k1_ge *)0x80000) {
        return iVar5;
      }
    }
    psStack_4c8 = (secp256k1_ge *)0x14d4a1;
    test_pre_g_table_cold_9();
LAB_0014d4a1:
    psStack_4c8 = (secp256k1_ge *)0x14d4a6;
    test_pre_g_table_cold_8();
LAB_0014d4a6:
    psStack_4c8 = (secp256k1_ge *)0x14d4ab;
    test_pre_g_table_cold_7();
LAB_0014d4ab:
    psStack_4c8 = (secp256k1_ge *)0x14d4b0;
    test_pre_g_table_cold_6();
LAB_0014d4b0:
    r_04 = psVar18;
    psStack_4c8 = (secp256k1_ge *)0x14d4b5;
    test_pre_g_table_cold_5();
LAB_0014d4b5:
    psStack_4c8 = (secp256k1_ge *)0x14d4ba;
    test_pre_g_table_cold_4();
LAB_0014d4ba:
    psStack_4c8 = (secp256k1_ge *)0x14d4bf;
    test_pre_g_table_cold_3();
    r_03 = r_04;
    r_04 = a_01;
LAB_0014d4bf:
    psStack_4c8 = (secp256k1_ge *)0x14d4c4;
    test_pre_g_table_cold_1();
LAB_0014d4c4:
    psStack_4c8 = (secp256k1_ge *)0x14d4c9;
    test_pre_g_table_cold_2();
  }
  psStack_4c8 = (secp256k1_ge *)secp256k1_wnaf_fixed;
  test_pre_g_table_cold_10();
  pcStack_520 = (code *)0x14d4ed;
  psVar18 = psVar16;
  psStack_4f0 = r_01;
  psStack_4e8 = psVar25;
  psStack_4e0 = r_02;
  psStack_4d8 = r_03;
  psStack_4d0 = r_04;
  psStack_4c8 = psVar13;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar16);
  auVar30._0_4_ = -(uint)((int)(psVar16->x).n[2] == 0 && (int)(psVar16->x).n[0] == 0);
  auVar30._4_4_ =
       -(uint)(*(int *)((long)(psVar16->x).n + 0x14) == 0 && *(int *)((long)(psVar16->x).n + 4) == 0
              );
  auVar30._8_4_ = -(uint)((int)(psVar16->x).n[3] == 0 && (int)(psVar16->x).n[1] == 0);
  auVar30._12_4_ =
       -(uint)(*(int *)((long)(psVar16->x).n + 0x1c) == 0 &&
              *(int *)((long)(psVar16->x).n + 0xc) == 0);
  iVar5 = movmskps(extraout_EAX,auVar30);
  if (iVar5 == 0xf) {
    if (-1 < (int)(0x7f / (long)(int)extraout_EDX)) {
      pcStack_520 = (code *)0x14d5e7;
      memset(a_00,0,(0x7f / (long)(int)extraout_EDX & 0xffffffffU) * 4 + 4);
    }
    return 0;
  }
  pcStack_520 = (code *)0x14d51a;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar16);
  uVar4 = (uint)(psVar16->x).n[0];
  pcStack_520 = (code *)0x14d526;
  psVar13 = psVar16;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar16);
  if (0xffffffdf < extraout_EDX - 0x21) {
    uVar4 = ~uVar4 & 1;
    pcStack_520 = (code *)0x14d544;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar16);
    bVar8 = (byte)extraout_EDX;
    *(uint *)(a_00->x).n =
         ((uint)((int)(psVar16->x).n[extraout_EDX - 1 >> 6] << (-bVar8 & 0x1f)) >> (-bVar8 & 0x1f))
         + uVar4;
    bVar3 = 0x7f / bVar8;
    uStack_4f8 = (ulong)bVar3;
    uVar12 = (uint)bVar3;
    uVar26 = 0x80 - bVar3 * extraout_EDX;
    uVar20 = uStack_4f8;
    uStack_50c = uVar4;
    psStack_500 = psVar16;
    do {
      uVar4 = extraout_EDX;
      if (uVar20 == uStack_4f8) {
        uVar4 = uVar26;
      }
      pcStack_520 = (code *)0x14d59f;
      uVar6 = secp256k1_scalar_get_bits_var
                        ((secp256k1_scalar *)psStack_500,(uint)uVar20 * extraout_EDX,uVar4);
      uVar4 = (uint)uVar20;
      if (uVar6 != 0) break;
      *(undefined4 *)((long)(a_00->x).n + uVar20 * 4) = 0;
      uVar12 = uVar12 - 1;
      bVar29 = 1 < (long)uVar20;
      uVar20 = uVar20 - 1;
      uVar4 = uVar12;
    } while (bVar29);
    if ((int)uVar4 < 1) {
      return uStack_50c;
    }
    iStack_508 = -1 << (bVar8 & 0x1f);
    iStack_504 = 1 << (bVar8 & 0x1f);
    uVar20 = 1;
    uVar12 = extraout_EDX;
    do {
      count = extraout_EDX;
      if (uStack_4f8 == uVar20) {
        count = uVar26;
      }
      pcStack_520 = (code *)0x14d63c;
      uVar6 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psStack_500,uVar12,count);
      if ((uVar6 & 1) == 0) {
        piVar2 = (int *)((long)(a_00->x).n + uVar20 * 4 + -4);
        *piVar2 = *piVar2 + iStack_508;
        uVar6 = uVar6 | 1;
      }
      *(uint32_t *)((long)(a_00->x).n + uVar20 * 4) = uVar6;
      if (1 < uVar20) {
        iVar5 = *(int *)((long)(a_00->x).n + uVar20 * 4 + -4);
        if (iVar5 == -1) {
          iVar5 = *(int *)((long)(a_00->x).n + uVar20 * 4 + -8);
          if (0 < iVar5) {
            iVar5 = iVar5 + iStack_508;
            goto LAB_0014d681;
          }
        }
        else if ((iVar5 == 1) && (iVar5 = *(int *)((long)(a_00->x).n + uVar20 * 4 + -8), iVar5 < 0))
        {
          iVar5 = iVar5 + iStack_504;
LAB_0014d681:
          *(int *)((long)(a_00->x).n + uVar20 * 4 + -8) = iVar5;
          *(undefined4 *)((long)(a_00->x).n + uVar20 * 4 + -4) = 0;
        }
      }
      uVar20 = uVar20 + 1;
      uVar12 = uVar12 + extraout_EDX;
      if (uVar4 + 1 == uVar20) {
        return uStack_50c;
      }
    } while( true );
  }
  pcStack_520 = test_fixed_wnaf_small_helper;
  secp256k1_wnaf_fixed_cold_1();
  uVar20 = 0x20;
  do {
    uVar12 = (int)uVar20 - 1;
    uVar20 = (ulong)uVar12;
    if (*(int *)((long)(psVar13->x).n + uVar20 * 4) != 0) {
      pcStack_528 = (code *)0x14d6e2;
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_0014d6e2;
    }
  } while (8 < uVar12);
  uVar12 = 7;
  while (*(int *)((long)(psVar13->x).n + (ulong)uVar12 * 4) ==
         *(int *)((long)(psVar18->x).n + (ulong)uVar12 * 4)) {
    bVar29 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    if (bVar29) {
      return extraout_EAX_00;
    }
  }
LAB_0014d6e2:
  pcStack_528 = test_ecmult_target;
  test_fixed_wnaf_small_helper_cold_2();
  psVar23 = (secp256k1_gej *)auStack_1148;
  psVar14 = (secp256k1_strauss_point_state *)((ulong)psVar18 & 0xffffffff);
  psVar27 = (secp256k1_scalar *)auStack_1128;
  psStack_1150 = (secp256k1_strauss_point_state *)0x14d70a;
  psStack_550 = a_00;
  psStack_548 = psVar16;
  psStack_540 = r_02;
  uStack_538 = (ulong)extraout_EDX;
  psStack_530 = r_04;
  pcStack_528 = (code *)(ulong)uVar4;
  testutil_random_scalar_order_test(psVar27);
  psStack_1150 = (secp256k1_strauss_point_state *)0x14d71b;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_1148,psVar27,(secp256k1_scalar *)psVar13);
  psStack_1150 = (secp256k1_strauss_point_state *)0x14d726;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_1148,(secp256k1_scalar *)auStack_1148);
  if ((int)psVar18 == 0) {
    psStack_1150 = (secp256k1_strauss_point_state *)0x14d81f;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_fc0,(secp256k1_scalar *)auStack_1128);
    psStack_1150 = (secp256k1_strauss_point_state *)0x14d836;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1058,(secp256k1_scalar *)auStack_1148);
    psStack_1150 = (secp256k1_strauss_point_state *)0x14d84a;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_10f0,(secp256k1_scalar *)psVar13);
  }
  else {
    psStack_1150 = (secp256k1_strauss_point_state *)0x14d73e;
    testutil_random_ge_test(&sStack_f28);
    psStack_1150 = (secp256k1_strauss_point_state *)0x14d74e;
    secp256k1_gej_set_ge(&sStack_ec0,&sStack_f28);
    if ((int)psVar18 == 1) {
      psVar16 = asStack_e28;
      r_02 = asStack_ca8;
      psVar14 = &sStack_968;
      psVar27 = &secp256k1_scalar_zero;
      psStack_1150 = (secp256k1_strauss_point_state *)0x14d7ae;
      sStack_1058.x.n[0] = (uint64_t)psVar16;
      sStack_1058.x.n[1] = (uint64_t)r_02;
      sStack_1058.x.n[2] = (uint64_t)psVar14;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_1058,&sStack_fc0,1,&sStack_ec0,
                 (secp256k1_scalar *)auStack_1128,&secp256k1_scalar_zero);
      psStack_1150 = (secp256k1_strauss_point_state *)0x14d7d9;
      sStack_10f0.x.n[0] = (uint64_t)psVar16;
      sStack_10f0.x.n[1] = (uint64_t)r_02;
      sStack_10f0.x.n[2] = (uint64_t)psVar14;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_10f0,&sStack_1058,1,&sStack_ec0,
                 (secp256k1_scalar *)auStack_1148,&secp256k1_scalar_zero);
      psStack_1150 = (secp256k1_strauss_point_state *)0x14d801;
      auStack_1128._32_8_ = psVar16;
      psStack_1100 = r_02;
      psStack_10f8 = psVar14;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(auStack_1128 + 0x20),&sStack_10f0,1,&sStack_ec0,
                 (secp256k1_scalar *)psVar13,&secp256k1_scalar_zero);
      psVar23 = &sStack_ec0;
    }
    else {
      psVar27 = (secp256k1_scalar *)&sStack_f28;
      psStack_1150 = (secp256k1_strauss_point_state *)0x14d869;
      secp256k1_ecmult_const(&sStack_fc0,(secp256k1_ge *)psVar27,(secp256k1_scalar *)auStack_1128);
      psStack_1150 = (secp256k1_strauss_point_state *)0x14d87c;
      secp256k1_ecmult_const(&sStack_1058,(secp256k1_ge *)psVar27,(secp256k1_scalar *)auStack_1148);
      psStack_1150 = (secp256k1_strauss_point_state *)0x14d88c;
      secp256k1_ecmult_const(&sStack_10f0,(secp256k1_ge *)psVar27,(secp256k1_scalar *)psVar13);
      psVar23 = (secp256k1_gej *)auStack_1148;
    }
  }
  psStack_1150 = (secp256k1_strauss_point_state *)0x14d8a6;
  secp256k1_gej_add_var(&sStack_10f0,&sStack_10f0,&sStack_fc0,(secp256k1_fe *)0x0);
  psStack_1150 = (secp256k1_strauss_point_state *)0x14d8bb;
  psVar19 = &sStack_10f0;
  secp256k1_gej_add_var(&sStack_10f0,&sStack_10f0,&sStack_1058,(secp256k1_fe *)0x0);
  psStack_1150 = (secp256k1_strauss_point_state *)0x14d8c3;
  psVar22 = &sStack_10f0;
  secp256k1_gej_verify(&sStack_10f0);
  if (sStack_10f0.infinity != 0) {
    return extraout_EAX_01;
  }
  psStack_1150 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar22 & 0xffffffff);
  pcStack_12b8 = (code *)0x14d911;
  psStack_12a0 = psVar19;
  lStack_1298 = extraout_RDX;
  psStack_1178 = &sStack_10f0;
  psStack_1170 = psVar16;
  psStack_1168 = r_02;
  psStack_1160 = (secp256k1_ge *)psVar27;
  psStack_1158 = psVar23;
  psStack_1150 = psVar14;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_12a6 = SUB84(psVar22,0);
  psVar28 = &sStack_11e0;
  sStack_11e0.s[0] = 0x6a09e667;
  sStack_11e0.s[1] = 0xbb67ae85;
  sStack_11e0.s[2] = 0x3c6ef372;
  sStack_11e0.s[3] = 0xa54ff53a;
  sStack_11e0.s[4] = 0x510e527f;
  sStack_11e0.s[5] = 0x9b05688c;
  sStack_11e0.s[6] = 0x1f83d9ab;
  sStack_11e0.s[7] = 0x5be0cd19;
  psVar19 = (secp256k1_gej *)0x0;
  sStack_11e0.bytes = 0;
  psVar27 = (secp256k1_scalar *)(auStack_1290 + 0x20);
  auStack_1290._32_8_ = 0;
  uStack_1268._0_4_ = 0;
  uStack_1268._4_4_ = 0;
  uStack_1260 = 0;
  uStack_1258 = 0;
  pcStack_12b8 = (code *)0x14d95b;
  secp256k1_scalar_verify(psVar27);
  pcStack_12b8 = (code *)0x14d969;
  test_ecmult_accumulate(psVar28,psVar27,scratch);
  auStack_1290._32_8_ = 1;
  uStack_1268._0_4_ = 0;
  uStack_1268._4_4_ = 0;
  uStack_1260 = 0;
  uStack_1258 = 0;
  pcStack_12b8 = (code *)0x14d985;
  secp256k1_scalar_verify(psVar27);
  pcStack_12b8 = (code *)0x14d993;
  test_ecmult_accumulate(psVar28,psVar27,scratch);
  pcStack_12b8 = (code *)0x14d99e;
  secp256k1_scalar_negate(psVar27,psVar27);
  pcStack_12b8 = (code *)0x14d9af;
  test_ecmult_accumulate(psVar28,psVar27,scratch);
  psVar23 = psStack_12a0;
  if (psStack_12a0 != (secp256k1_gej *)0x0) {
    psVar19 = (secp256k1_gej *)0x0;
    psVar28 = &sStack_1250;
    out32 = auStack_1290;
    do {
      uStack_12a2 = SUB82(psVar19,0);
      sStack_1250.s[0] = 0x6a09e667;
      sStack_1250.s[1] = 0xbb67ae85;
      sStack_1250.s[2] = 0x3c6ef372;
      sStack_1250.s[3] = 0xa54ff53a;
      sStack_1250.s[4] = 0x510e527f;
      sStack_1250.s[5] = 0x9b05688c;
      sStack_1250.s[6] = 0x1f83d9ab;
      sStack_1250.s[7] = 0x5be0cd19;
      sStack_1250.bytes = 0;
      pcStack_12b8 = (code *)0x14da0b;
      secp256k1_sha256_write(psVar28,(uchar *)&uStack_12a6,6);
      pcStack_12b8 = (code *)0x14da16;
      secp256k1_sha256_finalize(psVar28,out32);
      pcStack_12b8 = (code *)0x14da23;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_1290 + 0x20),out32,(int *)0x0);
      pcStack_12b8 = (code *)0x14da36;
      test_ecmult_accumulate(&sStack_11e0,(secp256k1_scalar *)(auStack_1290 + 0x20),scratch);
      psVar19 = (secp256k1_gej *)((long)(psVar19->x).n + 1);
    } while (psVar23 != psVar19);
  }
  hash = &sStack_11e0;
  psVar16 = (secp256k1_ge *)auStack_1290;
  pcStack_12b8 = (code *)0x14da50;
  secp256k1_sha256_finalize(hash,(uchar *)psVar16);
  lVar9 = 0;
  while (auStack_1290[lVar9] == *(char *)(lStack_1298 + lVar9)) {
    lVar9 = lVar9 + 1;
    if (lVar9 == 0x20) {
      pcStack_12b8 = (code *)0x14da78;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return extraout_EAX_02;
    }
  }
  pcStack_12b8 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_12c0 = psVar23;
  auStack_1f68 = (undefined1  [8])0x41;
  psStack_1f80 = (secp256k1_scalar *)0x14dac8;
  psStack_12e0 = scratch;
  psStack_12d8 = psVar28;
  puStack_12d0 = auStack_1290 + 0x20;
  psStack_12c8 = psVar19;
  pcStack_12b8 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_1d80,&secp256k1_ge_const_g);
  psStack_1f80 = (secp256k1_scalar *)0x14dad5;
  secp256k1_gej_set_infinity(&sStack_1e18);
  psStack_1f80 = (secp256k1_scalar *)0x14daec;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1ce8 + 1,(secp256k1_scalar *)psVar16);
  psVar14 = (secp256k1_strauss_point_state *)(asStack_1a38[5].y.n + 3);
  psStack_1f80 = (secp256k1_scalar *)0x14db3e;
  sStack_1eb0.x.n[0] = (uint64_t)asStack_1bb8;
  sStack_1eb0.x.n[1] = (uint64_t)asStack_1a38;
  sStack_1eb0.x.n[2] = (uint64_t)psVar14;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1eb0,&sStack_1ce8,1,&sStack_1d80,
             (secp256k1_scalar *)psVar16,&secp256k1_scalar_zero);
  psStack_1f80 = (secp256k1_scalar *)0x14db6e;
  auStack_1f60._0_8_ = asStack_1bb8;
  auStack_1f60._8_8_ = asStack_1a38;
  auStack_1f60._16_8_ = psVar14;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_1f60,&sStack_1eb0,1,&sStack_1e18,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar16);
  error_callback = (secp256k1_callback *)0xd0;
  psVar23 = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  psVar25 = (secp256k1_ge *)0x0;
  psStack_1f80 = (secp256k1_scalar *)0x14db9f;
  psVar27 = (secp256k1_scalar *)psVar16;
  psVar13 = scratch_00;
  iVar5 = secp256k1_ecmult_multi_var
                    ((secp256k1_callback *)psVar23,(secp256k1_scratch *)scratch_00,
                     (secp256k1_gej *)(asStack_1a38[5].y.n + 3),(secp256k1_scalar *)psVar16,
                     (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar5 == 0) {
    psStack_1f80 = (secp256k1_scalar *)0x14dd04;
    test_ecmult_accumulate_cold_8();
LAB_0014dd04:
    psStack_1f80 = (secp256k1_scalar *)0x14dd09;
    test_ecmult_accumulate_cold_7();
LAB_0014dd09:
    psStack_1f80 = (secp256k1_scalar *)0x14dd0e;
    test_ecmult_accumulate_cold_6();
LAB_0014dd0e:
    psStack_1f80 = (secp256k1_scalar *)0x14dd13;
    test_ecmult_accumulate_cold_5();
LAB_0014dd13:
    psStack_1f80 = (secp256k1_scalar *)0x14dd18;
    test_ecmult_accumulate_cold_4();
LAB_0014dd18:
    psStack_1f80 = (secp256k1_scalar *)0x14dd1d;
    test_ecmult_accumulate_cold_3();
LAB_0014dd1d:
    psStack_1f80 = (secp256k1_scalar *)0x14dd22;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar27 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_1f80 = (secp256k1_scalar *)0x14dbda;
    psVar13 = scratch_00;
    psVar23 = (secp256k1_gej *)error_callback;
    psVar25 = psVar16;
    iVar5 = secp256k1_ecmult_multi_var
                      (error_callback,(secp256k1_scratch *)scratch_00,asStack_1a38,
                       &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar16,1);
    if (iVar5 == 0) goto LAB_0014dd04;
    psStack_1f80 = (secp256k1_scalar *)0x14dbf9;
    secp256k1_ecmult_const(asStack_1bb8,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar16);
    psVar16 = (secp256k1_ge *)auStack_1f60;
    psStack_1f80 = (secp256k1_scalar *)0x14dc0e;
    secp256k1_ge_set_gej_var(psVar16,&sStack_1ce8 + 1);
    psVar23 = &sStack_1ce8;
    psStack_1f80 = (secp256k1_scalar *)0x14dc1e;
    psVar13 = psVar16;
    iVar5 = secp256k1_gej_eq_ge_var(psVar23,psVar16);
    if (iVar5 == 0) goto LAB_0014dd09;
    psVar23 = &sStack_1eb0;
    psVar13 = (secp256k1_ge *)auStack_1f60;
    psStack_1f80 = (secp256k1_scalar *)0x14dc38;
    iVar5 = secp256k1_gej_eq_ge_var(psVar23,psVar13);
    if (iVar5 == 0) goto LAB_0014dd0e;
    psVar23 = (secp256k1_gej *)(asStack_1a38[5].y.n + 3);
    psVar13 = (secp256k1_ge *)auStack_1f60;
    psStack_1f80 = (secp256k1_scalar *)0x14dc52;
    iVar5 = secp256k1_gej_eq_ge_var(psVar23,psVar13);
    if (iVar5 == 0) goto LAB_0014dd13;
    psVar23 = asStack_1a38;
    psVar13 = (secp256k1_ge *)auStack_1f60;
    psStack_1f80 = (secp256k1_scalar *)0x14dc6c;
    iVar5 = secp256k1_gej_eq_ge_var(psVar23,psVar13);
    if (iVar5 == 0) goto LAB_0014dd18;
    psVar23 = asStack_1bb8;
    psVar13 = (secp256k1_ge *)auStack_1f60;
    psStack_1f80 = (secp256k1_scalar *)0x14dc86;
    iVar5 = secp256k1_gej_eq_ge_var(psVar23,psVar13);
    if (iVar5 == 0) goto LAB_0014dd1d;
    psStack_1f80 = (secp256k1_scalar *)0x14dc9b;
    secp256k1_ge_verify((secp256k1_ge *)auStack_1f60);
    if (auStack_1f60._96_4_ != 0) {
      auStack_1f60[0x68] = 0;
      sVar11 = 1;
LAB_0014dce3:
      psStack_1f80 = (secp256k1_scalar *)0x14dced;
      secp256k1_sha256_write(hash,auStack_1f60 + 0x68,sVar11);
      return extraout_EAX_03;
    }
    psVar23 = (secp256k1_gej *)auStack_1f60;
    psVar13 = (secp256k1_ge *)(auStack_1f60 + 0x68);
    psVar16 = (secp256k1_ge *)auStack_1f68;
    psVar27 = (secp256k1_scalar *)0x0;
    psStack_1f80 = (secp256k1_scalar *)0x14dcd0;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar23,(uchar *)psVar13,(size_t *)psVar16,0);
    if (auStack_1f68 == (undefined1  [8])0x41) {
      sVar11 = 0x41;
      goto LAB_0014dce3;
    }
  }
  psStack_1f80 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_1f80 = &secp256k1_scalar_zero;
  psStack_1fa8 = asStack_1bb8;
  psStack_1fa0 = error_callback;
  psStack_1f90 = psVar16;
  psStack_1f88 = psVar14;
  secp256k1_gej_set_infinity(r_00);
  if ((secp256k1_ge *)psVar27 != (secp256k1_ge *)0x0 || hash != (secp256k1_sha256 *)0x0) {
    if (hash == (secp256k1_sha256 *)0x0) {
      sStack_2898.aux = asStack_2470;
      sStack_2898.pre_a = asStack_22f0;
      sStack_2898.ps = &sStack_2880;
      secp256k1_ecmult_strauss_wnaf(&sStack_2898,r_00,1,r_00,&secp256k1_scalar_zero,psVar27);
    }
    else {
      if ((psVar13 == (secp256k1_ge *)0x0) ||
         (sVar11 = secp256k1_pippenger_max_points
                             ((secp256k1_callback *)psVar23,(secp256k1_scratch *)psVar13),
         sVar11 == 0)) {
LAB_0014df51:
        iVar5 = secp256k1_ecmult_multi_simple_var(r_00,psVar27,cb,psVar25,(size_t)hash);
        return iVar5;
      }
      uVar20 = 5000000;
      if (sVar11 < 5000000) {
        uVar20 = sVar11;
      }
      puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
      uStack_28a0 = (ulong)puVar1 / uVar20 + 1;
      uVar20 = (ulong)puVar1 / uStack_28a0;
      if (uVar20 < 0x57) {
        lVar9 = 0;
        do {
          if (*(char *)((long)(psVar13->x).n + lVar9) != "scratch"[lVar9]) {
            (*(code *)(psVar23->x).n[0])("invalid scratch space",(psVar23->x).n[1]);
            goto LAB_0014df51;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 8);
        uVar10 = (psVar13->x).n[3] - (psVar13->x).n[2];
        uVar20 = 0;
        if (0x4a < uVar10) {
          uVar20 = uVar10 - 0x4b;
        }
        if (uVar20 < 0x988) goto LAB_0014df51;
        uVar20 = uVar20 / 0x988;
        if (4999999 < uVar20) {
          uVar20 = 5000000;
        }
        uStack_28a0 = (ulong)puVar1 / uVar20 + 1;
        uVar20 = (ulong)puVar1 / uStack_28a0;
        pcVar7 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar7 = secp256k1_ecmult_pippenger_batch;
      }
      psVar28 = (secp256k1_sha256 *)(uVar20 + 1);
      lVar9 = 0;
      uVar20 = 0;
      do {
        psVar15 = psVar28;
        if (hash < psVar28) {
          psVar15 = hash;
        }
        psVar16 = (secp256k1_ge *)0x0;
        if (uVar20 == 0) {
          psVar16 = (secp256k1_ge *)psVar27;
        }
        iVar5 = (*pcVar7)(psVar23,psVar13,&sStack_2880,psVar16,cb,psVar25,psVar15,lVar9);
        if (iVar5 == 0) {
          return 0;
        }
        secp256k1_gej_add_var(r_00,r_00,(secp256k1_gej *)&sStack_2880,(secp256k1_fe *)0x0);
        hash = (secp256k1_sha256 *)((long)hash - (long)psVar15);
        uVar20 = uVar20 + 1;
        lVar9 = (long)psVar28->s + lVar9;
      } while (uStack_28a0 != uVar20);
    }
  }
  return 1;
}

Assistant:

static int gej_xyz_equals_gej(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej a2;
    secp256k1_gej b2;
    int ret = 1;
    ret &= a->infinity == b->infinity;
    if (ret && !a->infinity) {
        a2 = *a;
        b2 = *b;
        secp256k1_fe_normalize(&a2.x);
        secp256k1_fe_normalize(&a2.y);
        secp256k1_fe_normalize(&a2.z);
        secp256k1_fe_normalize(&b2.x);
        secp256k1_fe_normalize(&b2.y);
        secp256k1_fe_normalize(&b2.z);
        ret &= secp256k1_fe_cmp_var(&a2.x, &b2.x) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.y, &b2.y) == 0;
        ret &= secp256k1_fe_cmp_var(&a2.z, &b2.z) == 0;
    }
    return ret;
}